

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queueTest.cpp
# Opt level: O1

int main(void)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  undefined1 auVar4 [8];
  undefined4 uVar5;
  ostream *poVar6;
  long *plVar7;
  _Map_pointer ppiVar8;
  int *piVar9;
  int iVar10;
  undefined1 auStack_248 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> std_3;
  queue<int,_std::deque<int,_std::allocator<int>_>_> std_2;
  queue<int,_ft::deque<int,_ft::allocator<int>_>_> ft;
  undefined1 auStack_128 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> std;
  undefined1 local_a8 [8];
  queue<int,_ft::deque<int,_ft::allocator<int>_>_> ft_2;
  
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_first = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_last = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_node
       = (_Map_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_cur
       = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_last
       = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size = 0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_cur
       = (_Elt_pointer)0x0;
  auStack_128 = (undefined1  [8])0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  ::std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_128,0);
  local_a8 = (undefined1  [8])&PTR__dequeIterator_0010acc8;
  ft_2.c.m_start.m_node = (map_pointer)&PTR__dequeIterator_0010acc8;
  ft_2.c.m_finish.m_node = (map_pointer)0x0;
  ft_2.c.m_map = (map_pointer)0x0;
  ft_2.c.m_map_size = 0;
  ft_2.c.m_chunks = 0;
  ::ft::deque<int,_ft::allocator<int>_>::dequeInit((deque<int,_ft::allocator<int>_> *)local_a8,0);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  if (std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
      _M_node ==
      (_Map_pointer)
      std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size)
  {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"std is empty",0xc)
    ;
    ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x68);
    ::std::ostream::put(-0x68);
    ::std::ostream::flush();
  }
  if (ft.c.m_chunks == 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout," ft is empty",0xc)
    ;
    ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x68);
    ::std::ostream::put(-0x68);
    ::std::ostream::flush();
  }
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&::std::cout,"size of std is: ",0x10);
  poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)&::std::cout);
  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  ::std::ostream::put((char)poVar6);
  ::std::ostream::flush();
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&::std::cout,"size of ft  is: ",0x10);
  poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)&::std::cout);
  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  ::std::ostream::put((char)poVar6);
  ::std::ostream::flush();
  ::ft::deque<int,_ft::allocator<int>_>::~deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_128);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"---",3);
  ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x68);
  ::std::ostream::put(-0x68);
  ::std::ostream::flush();
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_first = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_last = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_node
       = (_Map_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_cur
       = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_last
       = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size = 0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_cur
       = (_Elt_pointer)0x0;
  auStack_128 = (undefined1  [8])0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  ::std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_128,0);
  local_a8 = (undefined1  [8])&PTR__dequeIterator_0010acc8;
  ft_2.c.m_start.m_node = (map_pointer)&PTR__dequeIterator_0010acc8;
  ft_2.c.m_finish.m_node = (map_pointer)0x0;
  ft_2.c.m_map = (map_pointer)0x0;
  ft_2.c.m_map_size = 0;
  ft_2.c.m_chunks = 0;
  ::ft::deque<int,_ft::allocator<int>_>::dequeInit((deque<int,_ft::allocator<int>_> *)local_a8,0);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  local_a8._0_4_ = 1;
  iVar10 = 1;
  do {
    if (std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
        _M_node ==
        (_Map_pointer)
        (std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
         ._M_first + -1)) {
      ::std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                ((deque<int,std::allocator<int>> *)auStack_128,(int *)local_a8);
    }
    else {
      *(int *)std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_start._M_node = iVar10;
      std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
      _M_node = (_Map_pointer)
                ((long)std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_start._M_node + 4);
    }
    ::ft::deque<int,_ft::allocator<int>_>::push_back
              ((deque<int,_ft::allocator<int>_> *)
               &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node,(value_type *)local_a8);
    uVar5 = local_a8._0_4_;
    iVar10 = local_a8._0_4_ + 1;
    local_a8._0_4_ = iVar10;
  } while ((int)uVar5 < 5);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&::std::cout,"size of std is: ",0x10);
  poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)&::std::cout);
  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  ::std::ostream::put((char)poVar6);
  ::std::ostream::flush();
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&::std::cout,"size of ft  is: ",0x10);
  poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)&::std::cout);
  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  ::std::ostream::put((char)poVar6);
  ::std::ostream::flush();
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"front of std: ",0xe)
  ;
  plVar7 = (long *)::std::ostream::operator<<
                             ((ostream *)&::std::cout,
                              *(int *)std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                      super__Deque_impl_data._M_map_size);
  ::std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  ::std::ostream::put((char)plVar7);
  ::std::ostream::flush();
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"back of std: ",0xd);
  ppiVar8 = std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_start._M_node;
  if (std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
      _M_node ==
      (_Map_pointer)
      std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
      _M_cur) {
    ppiVar8 = (_Map_pointer)
              (*(long *)(std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_last + -2) + 0x200);
  }
  plVar7 = (long *)::std::ostream::operator<<((ostream *)&::std::cout,*(int *)((long)ppiVar8 + -4));
  ::std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  ::std::ostream::put((char)plVar7);
  ::std::ostream::flush();
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"front of ft: ",0xd);
  plVar7 = (long *)::std::ostream::operator<<
                             ((ostream *)&::std::cout,*(int *)ft.c.m_start._vptr_dequeIterator);
  ::std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  ::std::ostream::put((char)plVar7);
  ::std::ostream::flush();
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"back of ft: ",0xc);
  if (ft.c.m_finish._vptr_dequeIterator == (_func_int **)ft.c.m_finish.m_cur) {
    ft.c.m_finish._vptr_dequeIterator = (_func_int **)(*(long *)(ft.c.m_finish.m_last + -2) + 0x100)
    ;
  }
  plVar7 = (long *)::std::ostream::operator<<
                             ((ostream *)&::std::cout,
                              *(int *)((long)ft.c.m_finish._vptr_dequeIterator + -4));
  ::std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  ::std::ostream::put((char)plVar7);
  ::std::ostream::flush();
  print<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)auStack_128,"std");
  print<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"ft");
  ::ft::deque<int,_ft::allocator<int>_>::~deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_128);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"---",3);
  ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x68);
  ::std::ostream::put(-0x68);
  ::std::ostream::flush();
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_first = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_last = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_node
       = (_Map_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_cur
       = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_last
       = (_Elt_pointer)0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size = 0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_cur
       = (_Elt_pointer)0x0;
  auStack_128 = (undefined1  [8])0x0;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  ::std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_128,0);
  local_a8 = (undefined1  [8])&PTR__dequeIterator_0010acc8;
  ft_2.c.m_start.m_node = (map_pointer)&PTR__dequeIterator_0010acc8;
  ft_2.c.m_finish.m_node = (map_pointer)0x0;
  ft_2.c.m_map = (map_pointer)0x0;
  ft_2.c.m_map_size = 0;
  ft_2.c.m_chunks = 0;
  ::ft::deque<int,_ft::allocator<int>_>::dequeInit((deque<int,_ft::allocator<int>_> *)local_a8,0);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  iVar10 = 10;
  do {
    local_a8._0_4_ = iVar10;
    ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
              ((deque<int,_std::allocator<int>_> *)auStack_128,(int *)local_a8);
    local_a8._0_4_ = iVar10;
    ::ft::deque<int,_ft::allocator<int>_>::push_back
              ((deque<int,_ft::allocator<int>_> *)
               &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node,(value_type *)local_a8);
    iVar10 = iVar10 + 10;
  } while (iVar10 != 0x32);
  ::std::deque<int,_std::allocator<int>_>::deque
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(deque<int,_std::allocator<int>_> *)auStack_128);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  print<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"std");
  print<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8,"ft");
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::~deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_128);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"---",3);
  ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x68);
  ::std::ostream::put(-0x68);
  ::std::ostream::flush();
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_first = (_Elt_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_last = (_Elt_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = (_Map_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_cur = (_Elt_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = (_Elt_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size =
       0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_cur = (_Elt_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  ::std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,0);
  local_a8 = (undefined1  [8])&PTR__dequeIterator_0010acc8;
  ft_2.c.m_start.m_node = (map_pointer)&PTR__dequeIterator_0010acc8;
  ft_2.c.m_finish.m_node = (map_pointer)0x0;
  ft_2.c.m_map = (map_pointer)0x0;
  ft_2.c.m_map_size = 0;
  ft_2.c.m_chunks = 0;
  ::ft::deque<int,_ft::allocator<int>_>::dequeInit((deque<int,_ft::allocator<int>_> *)local_a8,0);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  local_a8._0_4_ = 0xe;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(int *)local_a8);
  local_a8._0_4_ = 8;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(int *)local_a8);
  local_a8._0_4_ = 0x10;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(int *)local_a8);
  local_a8._0_4_ = 10;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(int *)local_a8);
  local_a8._0_4_ = 0x14;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(int *)local_a8);
  local_a8._0_4_ = 0xe;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)local_a8);
  local_a8._0_4_ = 8;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)local_a8);
  local_a8._0_4_ = 0x10;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)local_a8);
  local_a8._0_4_ = 10;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)local_a8);
  local_a8._0_4_ = 0x14;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)local_a8);
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_first = (_Elt_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_last = (_Elt_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = (_Map_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_cur = (_Elt_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = (_Elt_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size =
       0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_cur = (_Elt_pointer)0x0;
  auStack_248 = (undefined1  [8])0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  ::std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_248,0);
  auStack_128 = (undefined1  [8])&PTR__dequeIterator_0010acc8;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_last
       = (_Elt_pointer)&PTR__dequeIterator_0010acc8;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)0x0;
  ::ft::deque<int,_ft::allocator<int>_>::dequeInit((deque<int,_ft::allocator<int>_> *)auStack_128,0)
  ;
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (deque<int,_ft::allocator<int>_> *)auStack_128);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)auStack_128);
  ::std::deque<int,_std::allocator<int>_>::operator=
            ((deque<int,_std::allocator<int>_> *)auStack_248,
             (deque<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::operator=
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  print<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)auStack_248,"std");
  print<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8,"ft");
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_248);
  ::ft::deque<int,_ft::allocator<int>_>::~deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"---",3);
  ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x68);
  ::std::ostream::put(-0x68);
  ::std::ostream::flush();
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)
            CONCAT44(std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node._4_4_,0x28);
  ::std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)auStack_128,4,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(allocator_type *)local_a8);
  local_a8._0_4_ = 0x28;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)operator_new(0x18);
  piVar9 = (int *)operator_new(0x18);
  *(undefined4 *)
   std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
   _M_node = 0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node[1] = (int *)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node[2] = (int *)0x0;
  *piVar9 = 0;
  piVar9[2] = 0;
  piVar9[3] = 0;
  piVar9[4] = 0;
  piVar9[5] = 0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node[2] = piVar9;
  *(_Map_pointer *)(piVar9 + 2) =
       std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
       ._M_node;
  ::ft::list<int,_ft::allocator<int>_>::assign
            ((list<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,4,(value_type *)local_a8);
  ::std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(list<int,_std::allocator<int>_> *)auStack_128);
  ::ft::list<int,_ft::allocator<int>_>::list
            ((list<int,_ft::allocator<int>_> *)local_a8,
             (list<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  p_Var2 = (_List_node_base *)
           &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_node;
  print<std::queue<int,std::__cxx11::list<int,std::allocator<int>>>>
            ((queue<int,_std::__cxx11::list<int,_std::allocator<int>_>_> *)p_Var2,"std");
  print<ft::queue<int,ft::list<int,ft::allocator<int>>>>
            ((queue<int,_ft::list<int,_ft::allocator<int>_>_> *)local_a8,"ft");
  ::ft::list<int,_ft::allocator<int>_>::~list((list<int,_ft::allocator<int>_> *)local_a8);
  p_Var3 = (_List_node_base *)
           std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_node;
  while (p_Var3 != p_Var2) {
    p_Var1 = (((list<int,_std::allocator<int>_> *)&p_Var3->_M_next)->
             super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.super__List_node_base.
             _M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var1;
  }
  ::ft::list<int,_ft::allocator<int>_>::~list
            ((list<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  auVar4 = auStack_128;
  while (auVar4 != (undefined1  [8])auStack_128) {
    p_Var2 = (((_List_base<int,_std::allocator<int>_> *)&((_List_node_base *)auVar4)->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    operator_delete((void *)auVar4,0x18);
    auVar4 = (undefined1  [8])p_Var2;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"---",3);
  ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x68);
  ::std::ostream::put(-0x68);
  ::std::ostream::flush();
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_first = (_Elt_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_last = (_Elt_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = (_Map_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_cur = (_Elt_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = (_Elt_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size =
       0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_cur = (_Elt_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)0x0;
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  ::std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,0);
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_first = (_Elt_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_last = (_Elt_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = (_Map_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_cur = (_Elt_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = (_Elt_pointer)0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size =
       0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_cur = (_Elt_pointer)0x0;
  auStack_248 = (undefined1  [8])0x0;
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  ::std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_248,0);
  local_a8 = (undefined1  [8])&PTR__dequeIterator_0010acc8;
  ft_2.c.m_start.m_node = (map_pointer)&PTR__dequeIterator_0010acc8;
  ft_2.c.m_finish.m_node = (map_pointer)0x0;
  ft_2.c.m_map = (map_pointer)0x0;
  ft_2.c.m_map_size = 0;
  ft_2.c.m_chunks = 0;
  ::ft::deque<int,_ft::allocator<int>_>::dequeInit((deque<int,_ft::allocator<int>_> *)local_a8,0);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  auStack_128 = (undefined1  [8])&PTR__dequeIterator_0010acc8;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_last
       = (_Elt_pointer)&PTR__dequeIterator_0010acc8;
  std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)0x0;
  ::ft::deque<int,_ft::allocator<int>_>::dequeInit((deque<int,_ft::allocator<int>_> *)auStack_128,0)
  ;
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (deque<int,_ft::allocator<int>_> *)auStack_128);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)auStack_128);
  auStack_128._0_4_ = 4;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(int *)auStack_128);
  auStack_128._0_4_ = 4;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)auStack_248,(int *)auStack_128);
  auStack_128._0_4_ = 4;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)auStack_128);
  auStack_128._0_4_ = 4;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,(value_type *)auStack_128);
  auStack_128._0_4_ = 0xf;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(int *)auStack_128);
  auStack_128._0_4_ = 0xf;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)auStack_248,(int *)auStack_128);
  auStack_128._0_4_ = 0xf;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)auStack_128);
  auStack_128._0_4_ = 0xf;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,(value_type *)auStack_128);
  auStack_128._0_4_ = 0x19;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(int *)auStack_128);
  auStack_128._0_4_ = 0x19;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)auStack_248,(int *)auStack_128);
  auStack_128._0_4_ = 0x19;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)auStack_128);
  auStack_128._0_4_ = 0x19;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,(value_type *)auStack_128);
  relational_operator<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"stdFoo",
             (queue<int,_std::deque<int,_std::allocator<int>_>_> *)auStack_248,"stdBar");
  relational_operator<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"ftFoo",(queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8
             ,"ftBar");
  if ((_Elt_pointer)
      std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map_size ==
      std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
      _M_first + -1) {
    operator_delete(std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur,0x200);
    std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size
         = *(size_t *)
            (std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_start._M_last + 2);
    std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
    _M_first = (_Elt_pointer)
               (std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_map_size + 0x200);
    std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
    _M_cur = (_Elt_pointer)
             std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_map_size;
    std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
    _M_last = std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_start._M_last + 2;
  }
  else {
    std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size
         = std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_map_size + 4;
  }
  auStack_128._0_4_ = 0x21;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(int *)auStack_128);
  auStack_128._0_4_ = 0x21;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)auStack_128);
  relational_operator<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"stdFoo",
             (queue<int,_std::deque<int,_std::allocator<int>_>_> *)auStack_248,"stdBar");
  relational_operator<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"ftFoo",(queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8
             ,"ftBar");
  if ((_Elt_pointer)
      std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map_size ==
      std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
      _M_first + -1) {
    operator_delete(std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur,0x200);
    std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size
         = *(size_t *)
            (std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_start._M_last + 2);
    std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
    _M_first = (_Elt_pointer)
               (std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_map_size + 0x200);
    std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
    _M_cur = (_Elt_pointer)
             std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_map_size;
    std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
    _M_last = std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_start._M_last + 2;
  }
  else {
    std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size
         = std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_map_size + 4;
  }
  auStack_128._0_4_ = 0x21;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)auStack_248,(int *)auStack_128);
  auStack_128._0_4_ = 2;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)auStack_248,(int *)auStack_128);
  ft_2.c.m_start._vptr_dequeIterator = (_func_int **)((long)ft_2.c.m_start._vptr_dequeIterator + 4);
  if (ft_2.c.m_start._vptr_dequeIterator == (_func_int **)ft_2.c.m_start.m_first) {
    ft_2.c.m_start._vptr_dequeIterator = *(_func_int ***)(ft_2.c.m_start.m_last + 2);
    ft_2.c.m_start.m_first = (pointer)(ft_2.c.m_start._vptr_dequeIterator + 0x20);
    ft_2.c.m_start.m_cur = (pointer)ft_2.c.m_start._vptr_dequeIterator;
    ft_2.c.m_start.m_last = ft_2.c.m_start.m_last + 2;
  }
  ft_2.c.m_chunks = ft_2.c.m_chunks - 1;
  auStack_128._0_4_ = 0x21;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,(value_type *)auStack_128);
  auStack_128._0_4_ = 2;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,(value_type *)auStack_128);
  relational_operator<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"stdFoo",
             (queue<int,_std::deque<int,_std::allocator<int>_>_> *)auStack_248,"stdBar");
  relational_operator<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"ftFoo",(queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8
             ,"ftBar");
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_248);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  return 0;
}

Assistant:

int 	main() {
	{ // constructors and some basic functions
		std::queue<int>	std;
		ft::queue<int>	ft;

		if (std.empty()) std::cout << "std is empty" << std::endl;
		if (ft.empty()) std::cout << " ft is empty" << std::endl;

		std::cout << "size of std is: " << std.size() << std::endl;
		std::cout << "size of ft  is: " << ft.size() << std::endl;
	}

	std::cout << "---" << std::endl;

	{ // push pop and element access at the front and back
		std::queue<int>	std;
		ft::queue<int>	ft;

		for (int i = 1; i <= 5; ++i) {
			std.push(i);
			ft.push(i);
		}

		std::cout << "size of std is: " << std.size() << std::endl;
		std::cout << "size of ft  is: " << ft.size() << std::endl;

		std::cout << "front of std: " << std.front() << std::endl;
		std::cout << "back of std: " << std.back() << std::endl;
		std::cout << "front of ft: " << ft.front() << std::endl;
		std::cout << "back of ft: " << ft.back() << std::endl;

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // copy constructor
		std::queue<int>	stdCopy;
		ft::queue<int>	ftCopy;

		for (int i = 1; i <= 4; ++i) {
			stdCopy.push(i * 10);
			ftCopy.push(i * 10);
		}

		std::queue<int>	std(stdCopy);
		ft::queue<int>	ft(ftCopy);

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // assignment operator
		std::queue<int>	stdCopy;
		ft::queue<int>	ftCopy;

		stdCopy.push(14);
		stdCopy.push(8);
		stdCopy.push(16);
		stdCopy.push(10);
		stdCopy.push(20);

		ftCopy.push(14);
		ftCopy.push(8);
		ftCopy.push(16);
		ftCopy.push(10);
		ftCopy.push(20);


		std::queue<int>	std;
		ft::queue<int>	ft;

		std = stdCopy;
		ft = ftCopy;

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // different underlying container
		std::list<int>	stdL(4, 40);
		ft::list<int>	ftL(4, 40);

		std::queue<int, std::list<int> >	std(stdL);
		ft::queue<int, ft::list<int> >		ft(ftL);

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // relational operators
		std::queue<int>	stdFoo, stdBar;
		ft::queue<int>	ftFoo, ftBar;

		stdFoo.push(4);
		stdBar.push(4);
		ftFoo.push(4);
		ftBar.push(4);

		stdFoo.push(15);
		stdBar.push(15);
		ftFoo.push(15);
		ftBar.push(15);

		stdFoo.push(25);
		stdBar.push(25);
		ftFoo.push(25);
		ftBar.push(25);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);

		stdFoo.pop();
		stdFoo.push(33);
		ftFoo.pop();
		ftFoo.push(33);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);

		stdBar.pop();
		stdBar.push(33);
		stdBar.push(2);
		ftBar.pop();
		ftBar.push(33);
		ftBar.push(2);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);
	}
	return 0;
}